

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::_OnChangedVtxOffset(ImDrawList *this)

{
  long lVar1;
  int *in_RDI;
  ImDrawCmd *curr_cmd;
  ImDrawList *in_stack_00000020;
  
  in_RDI[0xd] = 0;
  lVar1 = *(long *)(in_RDI + 2) + (long)(*in_RDI + -1) * 0x38;
  if (*(int *)(lVar1 + 0x20) == 0) {
    *(int *)(lVar1 + 0x18) = in_RDI[0x28];
  }
  else {
    AddDrawCmd(in_stack_00000020);
  }
  return;
}

Assistant:

void ImDrawList::_OnChangedVtxOffset()
{
    // We don't need to compare curr_cmd->VtxOffset != _CmdHeader.VtxOffset because we know it'll be different at the time we call this.
    _VtxCurrentIdx = 0;
    IM_ASSERT_PARANOID(CmdBuffer.Size > 0);
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    //IM_ASSERT(curr_cmd->VtxOffset != _CmdHeader.VtxOffset); // See #3349
    if (curr_cmd->ElemCount != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);
    curr_cmd->VtxOffset = _CmdHeader.VtxOffset;
}